

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void gen_gvec_op3_ool(DisasContext_conflict1 *s,_Bool is_q,int rd,int rn,int rm,int data,
                     gen_helper_gvec_3_conflict1 *fn)

{
  undefined7 in_register_00000031;
  
  tcg_gen_gvec_3_ool_aarch64
            (s->uc->tcg_ctx,rd * 0x100 + 0xc10,rn * 0x100 + 0xc10,rm * 0x100 + 0xc10,
             (int)CONCAT71(in_register_00000031,is_q) * 8 + 8,s->sve_len,data,fn);
  return;
}

Assistant:

static void gen_gvec_op3_ool(DisasContext *s, bool is_q, int rd,
                             int rn, int rm, int data, gen_helper_gvec_3 *fn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    tcg_gen_gvec_3_ool(tcg_ctx, vec_full_reg_offset(s, rd),
                       vec_full_reg_offset(s, rn),
                       vec_full_reg_offset(s, rm),
                       is_q ? 16 : 8, vec_full_reg_size(s), data, fn);
}